

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O1

int_type __thiscall
OpenMD::basic_teebuf<char,_std::char_traits<char>_>::overflow
          (basic_teebuf<char,_std::char_traits<char>_> *this,int_type c)

{
  basic_streambuf<char,_std::char_traits<char>_> *pbVar1;
  int iVar2;
  int_type iVar3;
  pointer ppbVar4;
  
  iVar3 = -1;
  if ((c != -1) &&
     (ppbVar4 = (this->buffers_).
                super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start, iVar3 = c,
     ppbVar4 !=
     (this->buffers_).
     super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pbVar1 = *ppbVar4;
      if (*(undefined1 **)(pbVar1 + 0x28) < *(undefined1 **)(pbVar1 + 0x30)) {
        **(undefined1 **)(pbVar1 + 0x28) = (char)c;
        *(long *)(pbVar1 + 0x28) = *(long *)(pbVar1 + 0x28) + 1;
      }
      else {
        iVar2 = (**(code **)(*(long *)pbVar1 + 0x68))(pbVar1,c & 0xff);
        if (iVar2 == -1) {
          return -1;
        }
      }
      ppbVar4 = ppbVar4 + 1;
    } while (ppbVar4 !=
             (this->buffers_).
             super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return iVar3;
}

Assistant:

int_type overflow(int_type c = traits_type::eof()) {
      // avoid writing eof to stream
      if (c == traits_type::eof()) { return traits_type::eof(); }

      typename std::vector<streambuf_type*>::iterator
          iter;  // typename is needed since it's a dependant name
      for (iter = buffers_.begin(); iter != buffers_.end(); ++iter) {
        if ((*iter)->sputc(c) == traits_type::eof()) {
          return traits_type::eof();
        }
      }

      return traits_type::not_eof(c);
    }